

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O3

float png_get_pixel_aspect_ratio(png_const_structrp png_ptr,png_const_inforp info_ptr)

{
  float fVar1;
  
  fVar1 = 0.0;
  if (((info_ptr != (png_const_inforp)0x0 && png_ptr != (png_const_structrp)0x0) &&
      ((info_ptr->valid & 0x80) != 0)) && (info_ptr->x_pixels_per_unit != 0)) {
    fVar1 = (float)info_ptr->y_pixels_per_unit / (float)info_ptr->x_pixels_per_unit;
  }
  return fVar1;
}

Assistant:

float PNGAPI
png_get_pixel_aspect_ratio(png_const_structrp png_ptr, png_const_inforp
   info_ptr)
{
#ifdef PNG_READ_pHYs_SUPPORTED
   if (png_ptr != NULL && info_ptr != NULL &&
       (info_ptr->valid & PNG_INFO_pHYs) != 0)
   {
      png_debug1(1, "in %s retrieval function", "png_get_aspect_ratio");

      if (info_ptr->x_pixels_per_unit != 0)
         return ((float)((float)info_ptr->y_pixels_per_unit
             /(float)info_ptr->x_pixels_per_unit));
   }
#else
   PNG_UNUSED(png_ptr)
   PNG_UNUSED(info_ptr)
#endif

   return ((float)0.0);
}